

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

void __thiscall nv::FloatImage::initFrom(FloatImage *this,Image *img)

{
  ushort uVar1;
  ushort uVar2;
  Color32 CVar3;
  int iVar4;
  uint uVar5;
  uint h;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  bool bVar10;
  
  if (img == (Image *)0x0) {
    iVar4 = nvAbort("img != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x45,"void nv::FloatImage::initFrom(const Image *)");
    if (iVar4 == 1) {
      raise(5);
    }
  }
  uVar5 = Image::width(img);
  h = Image::height(img);
  allocate(this,4,uVar5,h);
  pfVar9 = this->m_mem;
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  uVar7 = (uint)uVar2 * (uint)uVar1;
  uVar8 = (ulong)uVar7;
  uVar5 = 0;
  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
    paVar6 = &Image::pixel(img,uVar5)->field_0;
    CVar3.field_0 = (anon_union_4_2_12391d8d_for_Color32_0)paVar6->u;
    *pfVar9 = (float)((uint)CVar3.field_0 >> 0x10 & 0xff) / 255.0;
    pfVar9[(ulong)uVar1 * (ulong)uVar2] = (float)((uint)CVar3.field_0 >> 8 & 0xff) / 255.0;
    pfVar9[uVar7 * 2] = (float)((uint)CVar3.field_0 & 0xff) / 255.0;
    pfVar9[uVar7 * 3] = (float)((uint)CVar3.field_0 >> 0x18) / 255.0;
    uVar5 = uVar5 + 1;
    pfVar9 = pfVar9 + 1;
  }
  return;
}

Assistant:

void FloatImage::initFrom(const Image * img)
{
	nvCheck(img != NULL);
	
	allocate(4, img->width(), img->height());
	
	float * red_channel = channel(0);
	float * green_channel = channel(1);
	float * blue_channel = channel(2);
	float * alpha_channel = channel(3);
	
	const uint count = m_width * m_height;
	for(uint i = 0; i < count; i++) {
		Color32 pixel = img->pixel(i);
		red_channel[i] = float(pixel.r) / 255.0f;
		green_channel[i] = float(pixel.g) / 255.0f;
		blue_channel[i] = float(pixel.b) / 255.0f;
		alpha_channel[i] = float(pixel.a) / 255.0f;
	}
}